

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O3

void av1_alloc_mb_wiener_var_pred_buf(AV1_COMMON *cm,ThreadData *td)

{
  uint8_t *puVar1;
  
  puVar1 = (uint8_t *)aom_memalign(0x20,0x4000L << ((byte)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1))
  ;
  td->wiener_tmp_pred_buf = puVar1;
  if (puVar1 != (uint8_t *)0x0) {
    return;
  }
  aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate td->wiener_tmp_pred_buf");
  return;
}

Assistant:

void av1_alloc_mb_wiener_var_pred_buf(AV1_COMMON *cm, ThreadData *td) {
  const int is_high_bitdepth = is_cur_buf_hbd(&td->mb.e_mbd);
  assert(MB_WIENER_PRED_BLOCK_SIZE < BLOCK_SIZES_ALL);
  const int buf_width = block_size_wide[MB_WIENER_PRED_BLOCK_SIZE];
  const int buf_height = block_size_high[MB_WIENER_PRED_BLOCK_SIZE];
  assert(buf_width == MB_WIENER_PRED_BUF_STRIDE);
  const size_t buf_size =
      (buf_width * buf_height * sizeof(*td->wiener_tmp_pred_buf))
      << is_high_bitdepth;
  CHECK_MEM_ERROR(cm, td->wiener_tmp_pred_buf, aom_memalign(32, buf_size));
}